

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::syntax::ProductionSyntax_*>::reallocateTo
          (SmallVectorBase<slang::syntax::ProductionSyntax_*> *this,size_type newCapacity)

{
  ProductionSyntax **__last;
  EVP_PKEY_CTX *ctx;
  ProductionSyntax **in_RSI;
  SmallVectorBase<slang::syntax::ProductionSyntax_*> *in_RDI;
  pointer newData;
  
  __last = (ProductionSyntax **)operator_new(0x75e9e6);
  begin(in_RDI);
  ctx = (EVP_PKEY_CTX *)end(in_RDI);
  std::uninitialized_move<slang::syntax::ProductionSyntax**,slang::syntax::ProductionSyntax**>
            (in_RSI,__last,(ProductionSyntax **)in_RDI);
  cleanup(in_RDI,ctx);
  in_RDI->cap = (size_type)in_RSI;
  in_RDI->data_ = __last;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }